

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  LogSeverity severity;
  
  if (reaction == kDefault) {
    severity = kWarning;
  }
  else {
    if (reaction != kAllow) {
      Expect(false,(char *)0x0,-1,msg);
      return;
    }
    severity = kInfo;
  }
  Log(severity,msg,3);
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const string& msg) {
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, 3);
      break;
    case kWarn:
      Log(kWarning, msg, 3);
      break;
    default:  // FAIL
      Expect(false, NULL, -1, msg);
  }
}